

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils-inl.hpp
# Opt level: O2

void CoreMLConverter::convertCaffeMetadata
               (string *name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *bottom,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *top,RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *nnWrite,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *mappingDataBlobNames)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  pointer pbVar3;
  string *psVar4;
  __type _Var5;
  bool bVar6;
  Type *this;
  iterator iVar7;
  key_type *pkVar8;
  Type *this_00;
  Type *pTVar9;
  ostream *poVar10;
  runtime_error *prVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  pointer pbVar12;
  int index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_1;
  string *value;
  string *value_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  ulong local_210;
  RepeatedPtrFieldBase *local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_200;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  uVar2 = (nnWrite->super_RepeatedPtrFieldBase).current_size_;
  local_210 = (ulong)uVar2;
  index = uVar2 - 1;
  local_208 = &nnWrite->super_RepeatedPtrFieldBase;
  local_200 = top;
  this = google::protobuf::internal::RepeatedPtrFieldBase::
         Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                   (&nnWrite->super_RepeatedPtrFieldBase,index);
  CoreML::Specification::NeuralNetworkLayer::set_name(this,name);
  inputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar3 = (bottom->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  p_Var1 = &(mappingDataBlobNames->_M_t)._M_impl.super__Rb_tree_header;
  for (pbVar12 = (bottom->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar3;
      pbVar12 = pbVar12 + 1) {
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&mappingDataBlobNames->_M_t,pbVar12);
    pkVar8 = pbVar12;
    if ((_Rb_tree_header *)iVar7._M_node != p_Var1) {
      pkVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](mappingDataBlobNames,pbVar12);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&inputs,pkVar8);
  }
  pbVar3 = (local_200->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar12 = (local_200->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar3;
      pbVar12 = pbVar12 + 1) {
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&mappingDataBlobNames->_M_t,pbVar12);
    pkVar8 = pbVar12;
    if ((_Rb_tree_header *)iVar7._M_node != p_Var1) {
      pkVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](mappingDataBlobNames,pbVar12);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&outputs,pkVar8);
  }
  value = inputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = inputs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((long)outputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)outputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
       (long)inputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)inputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) &&
     (_Var5 = std::operator==(outputs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              inputs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start),
     value = inputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
     psVar4 = inputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish, _Var5)) {
    if (index == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar10 = std::operator<<(local_1a8,
                                "CoreML Specification requires unique input and output names for each layer. First layer of the caffe network cannot have identical input and output names."
                               );
      std::endl<char,std::char_traits<char>>(poVar10);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,(string *)&local_230);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
              Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                        (local_208,(int)local_210 + -2);
    if ((this_00->output_).super_RepeatedPtrFieldBase.current_size_ == 1) {
      pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this_00->output_).super_RepeatedPtrFieldBase,0);
      bVar6 = std::operator!=(pTVar9,inputs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
      if (!bVar6) {
        std::operator+(&local_1d8,
                       inputs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,"_");
        std::__cxx11::to_string(&local_1f8,index);
        std::operator+(&local_230,&local_1d8,&local_1f8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                       &local_230,name);
        std::__cxx11::string::operator=
                  ((string *)
                   inputs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,(string *)&ss);
        std::__cxx11::string::~string((string *)&ss);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1d8);
        google::protobuf::internal::RepeatedPtrFieldBase::
        Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                  (&(this_00->output_).super_RepeatedPtrFieldBase);
        CoreML::Specification::NeuralNetworkLayer::add_output
                  (this_00,inputs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        value = inputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        psVar4 = inputs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        goto LAB_00470f96;
      }
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar10 = std::operator<<(local_1a8,"Current layer\'s (\'");
    poVar10 = std::operator<<(poVar10,(string *)name);
    poVar10 = std::operator<<(poVar10,"\') input name (\'");
    poVar10 = std::operator<<(poVar10,(string *)
                                      inputs.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
    std::operator<<(poVar10,"\') does not match previous layer\'s (\'");
    poVar10 = std::operator<<(local_1a8,(string *)(this_00->name_).ptr_);
    poVar10 = std::operator<<(poVar10,"\') output name (\'");
    pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&(this_00->output_).super_RepeatedPtrFieldBase,0);
    poVar10 = std::operator<<(poVar10,(string *)pTVar9);
    poVar10 = std::operator<<(poVar10,")\'");
    std::endl<char,std::char_traits<char>>(poVar10);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,(string *)&local_230);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00470f96:
  for (; pbVar12 = outputs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
      value_00 = outputs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, value != psVar4; value = value + 1) {
    CoreML::Specification::NeuralNetworkLayer::add_input(this,value);
  }
  for (; value_00 != pbVar12; value_00 = value_00 + 1) {
    CoreML::Specification::NeuralNetworkLayer::add_output(this,value_00);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&inputs);
  return;
}

Assistant:

inline void convertCaffeMetadata(const std::string& name,
                                     const std::vector<std::string>& bottom,
                                     const std::vector<std::string>& top,
                                     ::google::protobuf::RepeatedPtrField< ::CoreML::Specification::NeuralNetworkLayer >* nnWrite,
                                     std::map<std::string, std::string>& mappingDataBlobNames) {
        
        int currentLayerNumber = nnWrite->size() - 1;
        CoreML::Specification::NeuralNetworkLayer* specLayer = nnWrite->Mutable(currentLayerNumber);
        
        //set name
        specLayer->set_name(name);
        
        //get inputs and outputs
        std::vector<std::string> inputs;
        std::vector<std::string> outputs;
        for (const auto& input: bottom) {
            if(mappingDataBlobNames.find(input) == mappingDataBlobNames.end()){
                inputs.push_back(input);
            } else {
                inputs.push_back(mappingDataBlobNames[input]);
            }
        }
        for (const auto& output: top) {
            if(mappingDataBlobNames.find(output) == mappingDataBlobNames.end()){
                outputs.push_back(output);
            } else {
                outputs.push_back(mappingDataBlobNames[output]);
            }
        }
        
        if (outputs.size() == inputs.size() == 1 && outputs[0]==inputs[0]) {
            if (currentLayerNumber == 0) {
                std::stringstream ss;
                ss << "CoreML Specification requires unique input and output names for each layer. First layer of the caffe network cannot have identical input and output names." << std::endl;
                throw std::runtime_error(ss.str());
            } else {
                CoreML::Specification::NeuralNetworkLayer* previousSpecLayer = nnWrite->Mutable(currentLayerNumber-1);
                if (previousSpecLayer->output_size()!=1 || previousSpecLayer->output(0)!=inputs[0]){
                    std::stringstream ss;
                    ss << "Current layer's ('" << name << "') input name ('" << inputs[0] << "') does not match previous layer's ('" ;
                    ss << previousSpecLayer->name() << "') output name ('" << previousSpecLayer->output(0) <<")'" << std::endl;
                    throw std::runtime_error(ss.str());
                } else {
                    inputs[0] = inputs[0] + "_" + std::to_string(currentLayerNumber) + name;
                    previousSpecLayer->clear_output();
                    previousSpecLayer->add_output(inputs[0]);
                }
            }
        }
        
        // set input names
        for (const auto& input: inputs) {
            specLayer->add_input(input);
        }
        
        //set output names
        for (const auto& output: outputs) {
            specLayer->add_output(output);
        }

    }